

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp_number.hpp
# Opt level: O0

void __thiscall standards::exp_number<double>::exp_number(exp_number<double> *this,value_type v)

{
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  
  if (in_XMM0_Qa <= 0.0) {
    if (0.0 <= in_XMM0_Qa) {
      *(undefined4 *)(in_RDI + 1) = 0;
      *in_RDI = 0.0;
    }
    else {
      *(undefined4 *)(in_RDI + 1) = 0xffffffff;
      dVar1 = ::log(-in_XMM0_Qa);
      *in_RDI = dVar1;
    }
  }
  else {
    *(undefined4 *)(in_RDI + 1) = 1;
    dVar1 = ::log(in_XMM0_Qa);
    *in_RDI = dVar1;
  }
  return;
}

Assistant:

exp_number(value_type v) {
    if (v > 0) {
      sign_ = is_positive;
      log_ = std::log(v);
    } else if (v < 0) {
      sign_ = is_negative;
      log_ = std::log(-v);
    } else {
      sign_ = is_zero;
      log_ = 0;
    }
  }